

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ReorderLocals.cpp
# Opt level: O2

void __thiscall wasm::ReorderLocals::ReorderLocals(ReorderLocals *this)

{
  (this->
  super_WalkerPass<wasm::PostWalker<wasm::ReorderLocals,_wasm::Visitor<wasm::ReorderLocals,_void>_>_>
  ).super_Pass.runner = (PassRunner *)0x0;
  (this->
  super_WalkerPass<wasm::PostWalker<wasm::ReorderLocals,_wasm::Visitor<wasm::ReorderLocals,_void>_>_>
  ).super_Pass.name._M_dataplus._M_p =
       (pointer)&(this->
                 super_WalkerPass<wasm::PostWalker<wasm::ReorderLocals,_wasm::Visitor<wasm::ReorderLocals,_void>_>_>
                 ).super_Pass.name.field_2;
  (this->
  super_WalkerPass<wasm::PostWalker<wasm::ReorderLocals,_wasm::Visitor<wasm::ReorderLocals,_void>_>_>
  ).super_Pass.name._M_string_length = 0;
  (this->
  super_WalkerPass<wasm::PostWalker<wasm::ReorderLocals,_wasm::Visitor<wasm::ReorderLocals,_void>_>_>
  ).super_Pass.name.field_2._M_local_buf[0] = '\0';
  (this->
  super_WalkerPass<wasm::PostWalker<wasm::ReorderLocals,_wasm::Visitor<wasm::ReorderLocals,_void>_>_>
  ).super_PostWalker<wasm::ReorderLocals,_wasm::Visitor<wasm::ReorderLocals,_void>_>.
  super_Walker<wasm::ReorderLocals,_wasm::Visitor<wasm::ReorderLocals,_void>_>.replacep =
       (Expression **)0x0;
  (this->
  super_WalkerPass<wasm::PostWalker<wasm::ReorderLocals,_wasm::Visitor<wasm::ReorderLocals,_void>_>_>
  ).super_PostWalker<wasm::ReorderLocals,_wasm::Visitor<wasm::ReorderLocals,_void>_>.
  super_Walker<wasm::ReorderLocals,_wasm::Visitor<wasm::ReorderLocals,_void>_>.stack.usedFixed = 0;
  (this->
  super_WalkerPass<wasm::PostWalker<wasm::ReorderLocals,_wasm::Visitor<wasm::ReorderLocals,_void>_>_>
  ).super_PostWalker<wasm::ReorderLocals,_wasm::Visitor<wasm::ReorderLocals,_void>_>.
  super_Walker<wasm::ReorderLocals,_wasm::Visitor<wasm::ReorderLocals,_void>_>.stack.flexible.
  super__Vector_base<wasm::Walker<wasm::ReorderLocals,_wasm::Visitor<wasm::ReorderLocals,_void>_>::Task,_std::allocator<wasm::Walker<wasm::ReorderLocals,_wasm::Visitor<wasm::ReorderLocals,_void>_>::Task>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  *(pointer *)
   ((long)&(this->
           super_WalkerPass<wasm::PostWalker<wasm::ReorderLocals,_wasm::Visitor<wasm::ReorderLocals,_void>_>_>
           ).super_PostWalker<wasm::ReorderLocals,_wasm::Visitor<wasm::ReorderLocals,_void>_>.
           super_Walker<wasm::ReorderLocals,_wasm::Visitor<wasm::ReorderLocals,_void>_>.stack.
           flexible.
           super__Vector_base<wasm::Walker<wasm::ReorderLocals,_wasm::Visitor<wasm::ReorderLocals,_void>_>::Task,_std::allocator<wasm::Walker<wasm::ReorderLocals,_wasm::Visitor<wasm::ReorderLocals,_void>_>::Task>_>
           ._M_impl + 8) = (pointer)0x0;
  (this->
  super_WalkerPass<wasm::PostWalker<wasm::ReorderLocals,_wasm::Visitor<wasm::ReorderLocals,_void>_>_>
  ).super_PostWalker<wasm::ReorderLocals,_wasm::Visitor<wasm::ReorderLocals,_void>_>.
  super_Walker<wasm::ReorderLocals,_wasm::Visitor<wasm::ReorderLocals,_void>_>.currModule =
       (Module *)0x0;
  *(pointer *)
   ((long)&(this->
           super_WalkerPass<wasm::PostWalker<wasm::ReorderLocals,_wasm::Visitor<wasm::ReorderLocals,_void>_>_>
           ).super_PostWalker<wasm::ReorderLocals,_wasm::Visitor<wasm::ReorderLocals,_void>_>.
           super_Walker<wasm::ReorderLocals,_wasm::Visitor<wasm::ReorderLocals,_void>_>.stack.
           flexible.
           super__Vector_base<wasm::Walker<wasm::ReorderLocals,_wasm::Visitor<wasm::ReorderLocals,_void>_>::Task,_std::allocator<wasm::Walker<wasm::ReorderLocals,_wasm::Visitor<wasm::ReorderLocals,_void>_>::Task>_>
           ._M_impl + 0x10) = (pointer)0x0;
  (this->
  super_WalkerPass<wasm::PostWalker<wasm::ReorderLocals,_wasm::Visitor<wasm::ReorderLocals,_void>_>_>
  ).super_PostWalker<wasm::ReorderLocals,_wasm::Visitor<wasm::ReorderLocals,_void>_>.
  super_Walker<wasm::ReorderLocals,_wasm::Visitor<wasm::ReorderLocals,_void>_>.currFunction =
       (Function *)0x0;
  (this->
  super_WalkerPass<wasm::PostWalker<wasm::ReorderLocals,_wasm::Visitor<wasm::ReorderLocals,_void>_>_>
  ).super_Pass._vptr_Pass = (_func_int **)&PTR__ReorderLocals_00e20bf0;
  (this->counts).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->counts).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->counts).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->firstUses).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->firstUses).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->firstUses).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->firstUseIndex = 1;
  return;
}

Assistant:

bool isFunctionParallel() override { return true; }